

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O3

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::IntensityILS::getShuffledCells
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,IntensityILS *this,Station *s)

{
  pointer *pppVar1;
  double dVar2;
  iterator __position;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  int iVar6;
  pair<int,_int> in_RAX;
  pointer ppVar7;
  pair<int,_int> pVar8;
  pair<int,_int> pVar9;
  ulong uVar10;
  long lVar11;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = (s->I).rows_;
  if (0 < iVar6) {
    iVar5 = (s->I).cols_;
    pVar9.first = 0;
    pVar9.second = 0;
    local_38 = in_RAX;
    do {
      if (0 < iVar5) {
        lVar11 = 0;
        pVar8 = pVar9;
        do {
          dVar2 = (s->I).p[(long)pVar9][lVar11];
          if ((dVar2 != -1.0) || (NAN(dVar2))) {
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_38 = pVar8;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,__position,&local_38);
            }
            else {
              *__position._M_current = pVar8;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            iVar5 = (s->I).cols_;
          }
          lVar11 = lVar11 + 1;
          pVar8 = (pair<int,_int>)((long)pVar8 + 0x100000000);
        } while (lVar11 < iVar5);
        iVar6 = (s->I).rows_;
      }
      pVar9 = (pair<int,_int>)((long)pVar9 + 1);
    } while ((long)pVar9 < (long)iVar6);
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    ppVar4 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if ((ppVar3 != ppVar4) && (ppVar3 + 1 != ppVar4)) {
      uVar10 = 8;
      do {
        iVar6 = rand();
        lVar11 = (long)(iVar6 % ((int)(uVar10 >> 3) + 1));
        if (uVar10 != lVar11 * 8) {
          ppVar7 = ppVar3 + lVar11;
          iVar6 = *(int *)((long)&ppVar3->first + uVar10);
          *(int *)((long)&ppVar3->first + uVar10) = ppVar7->first;
          ppVar7->first = iVar6;
          iVar6 = *(int *)((long)&ppVar3->second + uVar10);
          *(int *)((long)&ppVar3->second + uVar10) = ppVar7->second;
          ppVar7->second = iVar6;
        }
        ppVar7 = (pointer)((long)&ppVar3[1].first + uVar10);
        uVar10 = uVar10 + 8;
      } while (ppVar7 != ppVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > IntensityILS::getShuffledCells(Station* s){
		 vector < pair<int, int> > cells;
		 for (int i=0; i<s->I.nb_rows();i++)
			 for (int j=0; j<s->I.nb_cols(); j++)
				 if(s->I(i,j)!=-1) cells.push_back(make_pair(i,j));
		 std::random_shuffle ( cells.begin(), cells.end(), myrandom);
		 return cells;
	 }